

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void signalPipeClose(curl_llist *pipeline,_Bool pipe_broke)

{
  Curl_easy *data;
  curl_llist_element *pcVar1;
  curl_llist_element *e;
  
  if (pipeline != (curl_llist *)0x0) {
    e = pipeline->head;
    while (e != (curl_llist_element *)0x0) {
      data = (Curl_easy *)e->ptr;
      pcVar1 = e->next;
      (data->state).pipe_broke = true;
      Curl_multi_handlePipeBreak(data);
      Curl_llist_remove(pipeline,e,(void *)0x0);
      e = pcVar1;
    }
  }
  return;
}

Assistant:

static void signalPipeClose(struct curl_llist *pipeline, bool pipe_broke)
{
  struct curl_llist_element *curr;

  if(!pipeline)
    return;

  curr = pipeline->head;
  while(curr) {
    struct curl_llist_element *next = curr->next;
    struct Curl_easy *data = (struct Curl_easy *) curr->ptr;

#ifdef DEBUGBUILD /* debug-only code */
    if(data->magic != CURLEASY_MAGIC_NUMBER) {
      /* MAJOR BADNESS */
      infof(data, "signalPipeClose() found BAAD easy handle\n");
    }
#endif

    if(pipe_broke)
      data->state.pipe_broke = TRUE;
    Curl_multi_handlePipeBreak(data);
    Curl_llist_remove(pipeline, curr, NULL);
    curr = next;
  }
}